

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

int __thiscall
stx::
btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>
::
find_lower<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::leaf_node>
          (btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
           *this,leaf_node *n,key_type *key)

{
  ushort uVar1;
  int lo;
  ulong uVar2;
  
  uVar1 = (n->super_node).slotuse;
  uVar2 = 0;
  while( true ) {
    if (uVar1 == uVar2) {
      return (uint)uVar1;
    }
    if (*key <= n->slotkey[uVar2]) break;
    uVar2 = uVar2 + 1;
  }
  return (int)uVar2;
}

Assistant:

inline int find_lower(const node_type *n, const key_type& key) const
        {
            if ( 0 && sizeof(n->slotkey) > traits::binsearch_threshold )
            {
                if (n->slotuse == 0) return 0;

                int lo = 0, hi = n->slotuse;

                while (lo < hi)
                {
                    int mid = (lo + hi) >> 1;

                    if (key_lessequal(key, n->slotkey[mid])) {
                        hi = mid; // key <= mid
                    }
                    else {
                        lo = mid + 1; // key > mid
                    }
                }

                BTREE_PRINT("btree::find_lower: on " << n << " key " << key << " -> " << lo << " / " << hi);

                // verify result using simple linear search
                if (selfverify)
                {
                    int i = 0;
                    while (i < n->slotuse && key_less(n->slotkey[i],key)) ++i;

                    BTREE_PRINT("btree::find_lower: testfind: " << i);
                    BTREE_ASSERT(i == lo);
                }

                return lo;
            }
            else // for nodes <= binsearch_threshold do linear search.
            {
                int lo = 0;
                while (lo < n->slotuse && key_less(n->slotkey[lo],key)) ++lo;
                return lo;
            }
        }